

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MonthDayDatatypeValidator.cpp
# Opt level: O3

XMLDateTime * __thiscall
xercesc_4_0::MonthDayDatatypeValidator::parse
          (MonthDayDatatypeValidator *this,XMLCh *content,MemoryManager *manager)

{
  XMLDateTime *this_00;
  
  this_00 = (XMLDateTime *)XMemory::operator_new(0x68,manager);
  XMLDateTime::XMLDateTime(this_00,content,manager);
  XMLDateTime::parseMonthDay(this_00);
  return this_00;
}

Assistant:

XMLDateTime* MonthDayDatatypeValidator::parse(const XMLCh* const content, MemoryManager* const manager)
{
    XMLDateTime *pRetDate = new (manager) XMLDateTime(content, manager);
    Janitor<XMLDateTime> jan(pRetDate);

    try
    {
        pRetDate->parseMonthDay();
    }
    catch(const OutOfMemoryException&)
    {
        jan.release();

        throw;
    }

    return jan.release();
}